

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

UpdateWitnessStackRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackRequest::ConvertToStruct
          (UpdateWitnessStackRequestStruct *__return_storage_ptr__,UpdateWitnessStackRequest *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  undefined1 local_130 [48];
  _Alloc_hider local_100;
  char local_f0 [16];
  _Alloc_hider local_e0;
  char local_d0 [16];
  bool local_c0;
  _Alloc_hider local_b8;
  char local_a8 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  (__return_storage_ptr__->tx)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tx).field_2;
  (__return_storage_ptr__->tx)._M_string_length = 0;
  (__return_storage_ptr__->tx).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->is_elements = false;
  (__return_storage_ptr__->txin).txid._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->txin).txid.field_2;
  (__return_storage_ptr__->txin).txid._M_string_length = 0;
  (__return_storage_ptr__->txin).txid.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->txin).vout = 0;
  (__return_storage_ptr__->txin).witness_stack.index = 0;
  (__return_storage_ptr__->txin).witness_stack.hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->txin).witness_stack.hex.field_2;
  (__return_storage_ptr__->txin).witness_stack.hex._M_string_length = 0;
  (__return_storage_ptr__->txin).witness_stack.hex.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->txin).witness_stack.type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->txin).witness_stack.type.field_2;
  *(undefined4 *)&(__return_storage_ptr__->txin).witness_stack.type.field_2 = 0x616e6962;
  *(undefined2 *)((long)&(__return_storage_ptr__->txin).witness_stack.type.field_2 + 4) = 0x7972;
  (__return_storage_ptr__->txin).witness_stack.type._M_string_length = 6;
  (__return_storage_ptr__->txin).witness_stack.type.field_2._M_local_buf[6] = '\0';
  (__return_storage_ptr__->txin).witness_stack.der_encode = false;
  (__return_storage_ptr__->txin).witness_stack.sighash_type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->txin).witness_stack.sighash_type.field_2;
  *(undefined4 *)&(__return_storage_ptr__->txin).witness_stack.sighash_type.field_2 = 0x6c6c61;
  (__return_storage_ptr__->txin).witness_stack.sighash_type._M_string_length = 3;
  (__return_storage_ptr__->txin).witness_stack.sighash_anyone_can_pay = false;
  (__return_storage_ptr__->txin).witness_stack.sighash_rangeproof = false;
  p_Var3 = &(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
            super__Rb_tree_header;
  (__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var3;
  *(_Rb_tree_header **)
   ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var3;
  (__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  UpdateWitnessStackTxInRequest::ConvertToStruct
            ((UpdateWitnessStackTxInRequestStruct *)local_130,&this->txin_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->txin,(string *)local_130);
  (__return_storage_ptr__->txin).vout = local_130._32_4_;
  (__return_storage_ptr__->txin).witness_stack.index = local_130._40_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).witness_stack.hex,(string *)&local_100);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).witness_stack.type,(string *)&local_e0);
  (__return_storage_ptr__->txin).witness_stack.der_encode = local_c0;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->txin).witness_stack.sighash_type,
             (string *)&local_b8);
  (__return_storage_ptr__->txin).witness_stack.sighash_anyone_can_pay = (bool)local_a8[0x10];
  (__return_storage_ptr__->txin).witness_stack.sighash_rangeproof = (bool)local_a8[0x11];
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t);
  if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_90._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_90._M_impl.super__Rb_tree_header._M_header._M_color;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) =
         local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) =
         local_90._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    (__return_storage_ptr__->txin).witness_stack.ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_90._M_impl.super__Rb_tree_header._M_node_count;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->txin).ignore_items._M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &local_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->txin).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  if (local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p);
  }
  if (local_100._M_p != local_f0) {
    operator_delete(local_100._M_p);
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackRequestStruct UpdateWitnessStackRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}